

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtw_stb_image.h
# Opt level: O3

uchar * __thiscall rtw_image::pixel_data(rtw_image *this,int x,int y)

{
  int iVar1;
  int iVar2;
  
  if (this->bdata != (uchar *)0x0) {
    iVar2 = this->image_width + -1;
    if (x < this->image_width) {
      iVar2 = x;
    }
    if (x < 0) {
      iVar2 = 0;
    }
    iVar1 = this->image_height + -1;
    if (y < this->image_height) {
      iVar1 = y;
    }
    if (y < 0) {
      iVar1 = 0;
    }
    return this->bdata +
           (long)iVar2 * (long)this->bytes_per_pixel + (long)iVar1 * (long)this->bytes_per_scanline;
  }
  return pixel_data::magenta;
}

Assistant:

const unsigned char* pixel_data(int x, int y) const {
        // Return the address of the three RGB bytes of the pixel at x,y. If there is no image
        // data, returns magenta.
        static unsigned char magenta[] = { 255, 0, 255 };
        if (bdata == nullptr) return magenta;

        x = clamp(x, 0, image_width);
        y = clamp(y, 0, image_height);

        return bdata + y*bytes_per_scanline + x*bytes_per_pixel;
    }